

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

bool tcu::verifyPointGroupRasterization
               (Surface *surface,PointSceneSpec *scene,RasterizationArguments *args,TestLog *log)

{
  bool bVar1;
  TestLog *log_local;
  RasterizationArguments *args_local;
  PointSceneSpec *scene_local;
  Surface *surface_local;
  
  bVar1 = anon_unknown_3::verifyMultisamplePointGroupRasterization(surface,scene,args,log);
  return bVar1;
}

Assistant:

bool verifyPointGroupRasterization (const tcu::Surface& surface, const PointSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log)
{
	// Splitting to triangles is a valid solution in multisampled cases and even in non-multisample cases too.
	return verifyMultisamplePointGroupRasterization(surface, scene, args, log);
}